

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_BYTE_v2::read
          (LASreadItemCompressed_BYTE_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  U32 UVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  int local_3c;
  undefined1 local_38;
  uint local_24;
  I32 value;
  U32 i;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_BYTE_v2 *this_local;
  
  for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
    bVar1 = this->last_item[local_24];
    UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_byte[local_24]);
    local_3c = bVar1 + UVar2;
    if (local_3c < 0) {
      local_38 = (undefined1)local_3c;
    }
    else {
      if (0xff < local_3c) {
        local_3c = local_3c + -0x100;
      }
      local_38 = (undefined1)local_3c;
    }
    *(undefined1 *)((long)CONCAT44(in_register_00000034,__fd) + (ulong)local_24) = local_38;
  }
  pvVar3 = memcpy(this->last_item,(void *)CONCAT44(in_register_00000034,__fd),(ulong)this->number);
  return (ssize_t)pvVar3;
}

Assistant:

inline void LASreadItemCompressed_BYTE_v2::read(U8* item, U32& context)
{
  U32 i;
  I32 value;
  for (i = 0; i < number; i++)
  {
    value = last_item[i] + dec->decodeSymbol(m_byte[i]);
    item[i] = U8_FOLD(value);
  }
  memcpy(last_item, item, number);
}